

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnMemoryCopy(TypeChecker *this,Limits *src_limits,Limits *dst_limits)

{
  undefined3 uVar1;
  Result RVar2;
  Opcode local_44;
  undefined1 local_40 [8];
  Limits size_limits;
  Limits *dst_limits_local;
  Limits *src_limits_local;
  TypeChecker *this_local;
  
  local_40 = (undefined1  [8])src_limits->initial;
  size_limits.initial = src_limits->max;
  size_limits.max._0_1_ = src_limits->has_max;
  size_limits.max._1_1_ = src_limits->is_shared;
  size_limits.max._2_1_ = src_limits->is_64;
  size_limits.max._3_5_ = *(undefined5 *)&src_limits->field_0x13;
  if (((src_limits->is_64 & 1U) != 0) && ((dst_limits->is_64 & 1U) == 0)) {
    local_40 = (undefined1  [8])dst_limits->initial;
    size_limits.initial = dst_limits->max;
    uVar1._0_1_ = dst_limits->has_max;
    uVar1._1_1_ = dst_limits->is_shared;
    uVar1._2_1_ = dst_limits->is_64;
    size_limits.max = CONCAT53(size_limits.max._3_5_,uVar1);
  }
  size_limits._16_8_ = dst_limits;
  Opcode::Opcode(&local_44,MemoryCopy);
  RVar2 = CheckOpcode3(this,local_44,src_limits,(Limits *)size_limits._16_8_,(Limits *)local_40);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnMemoryCopy(const Limits& src_limits,
                                 const Limits& dst_limits) {
  Limits size_limits = src_limits;
  // The memory64 proposal specifies that the type of the size argument should
  // be the mimimum of the two memory types.
  if (src_limits.is_64 && !dst_limits.is_64) {
    size_limits = dst_limits;
  }
  return CheckOpcode3(Opcode::MemoryCopy, &src_limits, &dst_limits,
                      &size_limits);
}